

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

IVec4 __thiscall tcu::getFormatMaxIntValue(tcu *this,TextureFormat *format)

{
  ChannelType CVar1;
  TextureFormat *this_00;
  bool bVar2;
  char cVar3;
  short sVar4;
  int s;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar5;
  IVec4 IVar6;
  bool local_29;
  TextureFormat local_28;
  TextureFormat local_20;
  TextureFormat *local_18;
  TextureFormat *format_local;
  
  local_18 = format;
  format_local = (TextureFormat *)this;
  TextureFormat::TextureFormat(&local_20,RGBA,SIGNED_INT_1010102_REV);
  bVar2 = TextureFormat::operator==(format,&local_20);
  this_00 = local_18;
  local_29 = true;
  if (!bVar2) {
    TextureFormat::TextureFormat(&local_28,BGRA,SIGNED_INT_1010102_REV);
    local_29 = TextureFormat::operator==(this_00,&local_28);
  }
  if (local_29 == false) {
    CVar1 = local_18->type;
    if (CVar1 == SIGNED_INT8) {
      cVar3 = std::numeric_limits<signed_char>::max();
      Vector<int,_4>::Vector((Vector<int,_4> *)this,(int)cVar3);
      uVar5 = extraout_RDX_00;
    }
    else if (CVar1 == SIGNED_INT16) {
      sVar4 = std::numeric_limits<short>::max();
      Vector<int,_4>::Vector((Vector<int,_4> *)this,(int)sVar4);
      uVar5 = extraout_RDX_01;
    }
    else if (CVar1 == SIGNED_INT32) {
      s = std::numeric_limits<int>::max();
      Vector<int,_4>::Vector((Vector<int,_4> *)this,s);
      uVar5 = extraout_RDX_02;
    }
    else {
      Vector<int,_4>::Vector((Vector<int,_4> *)this,0);
      uVar5 = extraout_RDX_03;
    }
  }
  else {
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x1ff,0x1ff,0x1ff,1);
    uVar5 = extraout_RDX;
  }
  IVar6.m_data[2] = (int)uVar5;
  IVar6.m_data[3] = (int)((ulong)uVar5 >> 0x20);
  IVar6.m_data._0_8_ = this;
  return (IVec4)IVar6.m_data;
}

Assistant:

IVec4 getFormatMaxIntValue (const TextureFormat& format)
{
	DE_ASSERT(getTextureChannelClass(format.type) == TEXTURECHANNELCLASS_SIGNED_INTEGER);

	if (format == TextureFormat(TextureFormat::RGBA, TextureFormat::SIGNED_INT_1010102_REV) ||
		format == TextureFormat(TextureFormat::BGRA, TextureFormat::SIGNED_INT_1010102_REV))
		return IVec4(511, 511, 511, 1);

	switch (format.type)
	{
		case TextureFormat::SIGNED_INT8:	return IVec4(std::numeric_limits<deInt8>::max());
		case TextureFormat::SIGNED_INT16:	return IVec4(std::numeric_limits<deInt16>::max());
		case TextureFormat::SIGNED_INT32:	return IVec4(std::numeric_limits<deInt32>::max());

		default:
			DE_FATAL("Invalid channel type");
			return IVec4(0);
	}
}